

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

JoypadStats joypad_get_stats(JoypadBuffer *buffer)

{
  JoypadBuffer *pJVar1;
  size_t sVar3;
  JoypadStats JVar2;
  
  JVar2.used_bytes = 0;
  JVar2.capacity_bytes = 0;
  pJVar1 = buffer;
  while( true ) {
    pJVar1 = (JoypadBuffer *)(pJVar1->sentinel).next;
    sVar3 = JVar2.capacity_bytes;
    if (pJVar1 == buffer) break;
    JVar2.used_bytes = JVar2.used_bytes + (pJVar1->sentinel).size * 0x10 + 0x28;
    JVar2.capacity_bytes = sVar3 + (pJVar1->sentinel).capacity * 0x10 + 0x28;
  }
  return JVar2;
}

Assistant:

JoypadStats joypad_get_stats(JoypadBuffer* buffer) {
  JoypadStats stats;
  ZERO_MEMORY(stats);
  JoypadChunk* sentinel = &buffer->sentinel;
  JoypadChunk* cur = sentinel->next;
  while (cur != sentinel) {
    size_t overhead = sizeof(*cur);
    stats.used_bytes += cur->size * sizeof(JoypadState) + overhead;
    stats.capacity_bytes += cur->capacity * sizeof(JoypadState) + overhead;
    cur = cur->next;
  }
  return stats;
}